

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

FunctionTableHolder * __thiscall
ImageTypeManager::functionTable(ImageTypeManager *this,uint8_t type)

{
  iterator iVar1;
  imageException *this_00;
  uint8_t type_local;
  
  iVar1 = std::
          _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>,_std::_Select1st<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
          ::find((_Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>,_std::_Select1st<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
                  *)this,&type_local);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header) {
    return (FunctionTableHolder *)&iVar1._M_node[1]._M_parent;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Function table is not initialised");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

const Image_Function_Helper::FunctionTableHolder & ImageTypeManager::functionTable( uint8_t type )
{
    std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::const_iterator table = _functionTableMap.find( type );
    if ( table == _functionTableMap.end() )
        throw imageException( "Function table is not initialised" );

    return table->second;
}